

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,read_wm_data>
          (xr_reader *this,size_type n,
          vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *container)

{
  bool bVar1;
  read_wm_data local_59;
  undefined1 local_58 [16];
  _Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_> local_48;
  
  std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::reserve(container,n);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._0_8_ = 0;
    local_58._8_8_ = 0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::emplace_back<xray_re::wm_data>
              (container,(wm_data *)local_58);
    std::_Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>::~_Vector_base
              (&local_48);
    read_wm_data::operator()
              (&local_59,
               (container->super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>).
               _M_impl.super__Vector_impl_data._M_finish + -1,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}